

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SendMessage.cpp
# Opt level: O0

SendMessage * __thiscall SendMessage::execute_abi_cxx11_(SendMessage *this)

{
  char *pcVar1;
  rep __val;
  ostream *poVar2;
  long in_RSI;
  allocator local_3f1;
  char local_3f0 [8];
  fstream mail;
  ostream local_3e0 [512];
  DIR *local_1e0;
  DIR *test;
  char *message_final_char;
  char *subject_char;
  char *sender_char;
  char *path_to_File;
  char *path;
  allocator local_189;
  string local_188 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [8];
  string path_to_file;
  allocator local_b1;
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [8];
  string path_of_Directory;
  string local_50 [8];
  string receiver_print;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  milliseconds ms;
  SendMessage *this_local;
  
  local_30.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_28.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_30);
  local_20.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_28);
  std::__cxx11::string::string(local_50,(string *)(in_RSI + 0xa8));
  std::__cxx11::string::pop_back();
  pcVar1 = *(char **)(in_RSI + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,pcVar1,&local_b1);
  std::operator+(local_90,(char)local_b0);
  std::operator+(local_70,local_90);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  pcVar1 = *(char **)(in_RSI + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,pcVar1,&local_189);
  std::operator+(local_168,(char)local_188);
  std::operator+(local_148,local_168);
  std::operator+(local_128,(char)local_148);
  __val = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_20);
  std::__cxx11::to_string((__cxx11 *)&path,__val);
  std::operator+(local_108,local_128);
  std::operator+(local_e8,(char *)local_108);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string((string *)local_148);
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  path_to_File = (char *)std::__cxx11::string::c_str();
  sender_char = (char *)std::__cxx11::string::c_str();
  subject_char = (char *)std::__cxx11::string::c_str();
  message_final_char = (char *)std::__cxx11::string::c_str();
  test = (DIR *)std::__cxx11::string::c_str();
  local_1e0 = opendir(path_to_File);
  if (local_1e0 == (DIR *)0x0) {
    mkdir(path_to_File,0x1ff);
  }
  else {
    closedir(local_1e0);
  }
  std::fstream::fstream(local_3f0);
  std::fstream::open(local_3f0,(_Ios_Openmode)sender_char);
  poVar2 = std::operator<<(local_3e0,"Sender: ");
  std::operator<<(poVar2,subject_char);
  poVar2 = std::operator<<(local_3e0,"Subject: ");
  std::operator<<(poVar2,message_final_char);
  std::operator<<(local_3e0,(char *)test);
  std::fstream::close();
  std::__cxx11::string::operator=((string *)(in_RSI + 8),(char *)(in_RSI + 0x36));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"Message sent!\n",&local_3f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  std::fstream::~fstream(local_3f0);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string(local_50);
  return this;
}

Assistant:

string SendMessage::execute() {
    std::chrono::milliseconds ms = std::chrono::duration_cast< std::chrono::milliseconds >(
            std::chrono::system_clock::now().time_since_epoch()
    );
    /// save receiver with \n on the end of the string
    string receiver_print = receiver;
    ///delete \n from the end of the string for routing in directories
    receiver.pop_back();
    ///build correct path into directory of the receiver
    string path_of_Directory = string(MESSAGEDIR) + '/' + receiver;
    ///build a unique path to the mail txt file
    string path_to_file = string(MESSAGEDIR) + '/' + receiver + '/' + std::to_string(ms.count()) + ".txt";

    ///convert all strings into char * for functions opendir, mkdir, fprintf
    const char * path = path_of_Directory.c_str();
    const char * path_to_File = path_to_file.c_str();
    const char * sender_char = sender.c_str();
    const char * subject_char = subject.c_str();
    const char * message_final_char = message_final.c_str();

    ///check if the directory is available, if not - create new
    DIR* test = opendir(path);
    if(test == nullptr){
        mkdir(path, 0777);
    }
    else{
        closedir(test);
    }

    ///open the file with the unique path
    fstream mail;
    mail.open(path_to_File, fstream::out);

    ///write all information into the mail-txt file.
    mail << "Sender: " << sender_char;
    mail << "Subject: " << subject_char;
    mail << message_final_char;

    ///close the file
    mail.close();

    statusMessage = SUCCESS;
    return "Message sent!\n";
}